

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O0

void __thiscall
boost::runtime::parameter<std::__cxx11::string,(boost::runtime::args_amount)0,false>::
parameter<boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::help_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::value_hint_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::env_var_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>>>>
          (parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(boost::runtime::args_amount)0,_false>
           *this,cstring *name,
          named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::value_hint_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>
          *m)

{
  bool bVar1;
  named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_RDX;
  basic_cstring<const_char> *in_RSI;
  invalid_param_spec *in_RDI;
  basic_cstring<const_char> *this_00;
  cstring *this_01;
  basic_cstring<const_char> *in_stack_fffffffffffffe10;
  specific_param_error<boost::runtime::invalid_param_spec,_boost::runtime::init_error>
  *in_stack_fffffffffffffe18;
  named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::value_hint_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>
  *in_stack_fffffffffffffe48;
  argument_factory<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  *in_stack_fffffffffffffe50;
  named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::value_hint_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>
  *in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff86;
  undefined1 in_stack_ffffffffffffff87;
  cstring *in_stack_ffffffffffffff88;
  basic_param *in_stack_ffffffffffffff90;
  basic_cstring<const_char> local_28;
  named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>
  *local_18;
  
  this_00 = &local_28;
  local_18 = in_RDX;
  unit_test::basic_cstring<const_char>::basic_cstring(this_00,in_RSI);
  basic_param::
  basic_param<boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::help_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::value_hint_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::env_var_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>>>>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(bool)in_stack_ffffffffffffff87,
             (bool)in_stack_ffffffffffffff86,in_stack_ffffffffffffff78);
  *(undefined ***)
   &(in_RDI->
    super_specific_param_error<boost::runtime::invalid_param_spec,_boost::runtime::init_error>).
    super_init_error.super_param_error = &PTR__parameter_00302fa8;
  this_01 = &in_RDI[4].
             super_specific_param_error<boost::runtime::invalid_param_spec,_boost::runtime::init_error>
             .super_init_error.super_param_error.param_name;
  argument_factory<std::__cxx11::string,false,false>::
  argument_factory<boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::help_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::value_hint_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::env_var_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>>>>
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  nfp::
  named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>
  ::has<boost::runtime::(anonymous_namespace)::default_value_t>(local_18);
  bVar1 = nfp::
          named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>
          ::has<boost::runtime::(anonymous_namespace)::optional_value_t>(local_18);
  if ((bVar1) &&
     ((in_RDI[3].
       super_specific_param_error<boost::runtime::invalid_param_spec,_boost::runtime::init_error>.
       super_init_error.super_param_error.field_0x1 & 1) != 0)) {
    unit_test::basic_cstring<const_char>::basic_cstring(in_RSI);
    invalid_param_spec::invalid_param_spec(in_RDI,this_00);
    specific_param_error<boost::runtime::invalid_param_spec,_boost::runtime::init_error>::operator<<
              ((specific_param_error<boost::runtime::invalid_param_spec,_boost::runtime::init_error>
                *)this_01,(char *)in_RDI);
    specific_param_error<boost::runtime::invalid_param_spec,boost::runtime::init_error>::operator<<
              (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
    specific_param_error<boost::runtime::invalid_param_spec,_boost::runtime::init_error>::operator<<
              ((specific_param_error<boost::runtime::invalid_param_spec,_boost::runtime::init_error>
                *)this_01,(char *)in_RDI);
    unit_test::ut_detail::throw_exception<boost::runtime::invalid_param_spec>(in_RDI);
  }
  return;
}

Assistant:

parameter( cstring name, Modifiers const& m )
#endif
    : basic_param( name, a != runtime::REQUIRED_PARAM, a == runtime::REPEATABLE_PARAM, m )
    , m_arg_factory( m )
    {
        BOOST_TEST_I_ASSRT( !m.has( default_value ) || a == runtime::OPTIONAL_PARAM,
                            invalid_param_spec() << "Parameter " << name
                                                 << " is not optional and can't have default_value." );

        BOOST_TEST_I_ASSRT( !m.has( optional_value ) || !this->p_repeatable,
                            invalid_param_spec() << "Parameter " << name
                                                 << " is repeatable and can't have optional_value." );
    }